

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_rom_reader.cpp
# Opt level: O0

void read_item_pre_uses(ROM *rom,World *world)

{
  uint8_t id;
  uint16_t uVar1;
  Item *pIVar2;
  uint local_1c;
  uint16_t branch_offset;
  uint8_t item_id;
  uint32_t addr;
  World *world_local;
  ROM *rom_local;
  
  local_1c = 0x8620;
  while ((local_1c < 0x86b0 && (id = md::ROM::get_byte(rom,local_1c + 4), id != 0xff))) {
    uVar1 = md::ROM::get_word(rom,local_1c + 2);
    pIVar2 = World::item(world,id);
    (*pIVar2->_vptr_Item[2])(pIVar2,(ulong)(local_1c + 2 + (uint)uVar1));
    local_1c = local_1c + 6;
  }
  return;
}

Assistant:

static void read_item_pre_uses(const md::ROM& rom, World& world)
{
    for(uint32_t addr = offsets::ITEM_PRE_USE_TABLE ; addr < offsets::ITEM_PRE_USE_TABLE_END ; addr += 0x6)
    {
        uint8_t item_id = rom.get_byte(addr + 0x4);
        if(item_id == 0xFF)
            break;

        uint16_t branch_offset = rom.get_word(addr + 0x02);
        world.item(item_id)->pre_use_address(addr + 0x02 + branch_offset);
    }
}